

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int mg_split_form_urlencoded(char *data,mg_header *form_fields,uint num_form_fields)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char cVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  
  uVar2 = 0xffffffff;
  if (data != (char *)0x0) {
    if (num_form_fields == 0 && form_fields == (mg_header *)0x0) {
      cVar4 = *data;
      if (cVar4 != '\0') {
        pcVar5 = data + 1;
        iVar1 = 1;
        do {
          if (cVar4 == '&') {
            iVar1 = iVar1 + 1;
          }
          else if (cVar4 == '\0') {
            return iVar1;
          }
          cVar4 = *pcVar5;
          pcVar5 = pcVar5 + 1;
        } while( true );
      }
      uVar2 = 0;
    }
    else if (0 < (int)num_form_fields && form_fields != (mg_header *)0x0) {
      uVar7 = 0;
      pcVar5 = data;
      do {
        while( true ) {
          pcVar5 = pcVar5 + 1;
          cVar4 = *data;
          if ((cVar4 != '\t') && (cVar4 != ' ')) break;
          data = data + 1;
        }
        if (cVar4 == '\0') {
LAB_0010eb03:
          num_form_fields = (uint)uVar7;
          break;
        }
        form_fields[uVar7].name = data;
        for (; (cVar4 = pcVar5[-1], cVar4 != '\0' && (cVar4 != '&')); pcVar5 = pcVar5 + 1) {
          if (cVar4 == '=') {
            pcVar5[-1] = '\0';
            data = pcVar5;
            goto LAB_0010eadd;
          }
        }
        pcVar5 = (char *)0x0;
LAB_0010eadd:
        form_fields[uVar7].value = pcVar5;
        uVar7 = uVar7 + 1;
        pcVar5 = strchr(data,0x26);
        if (pcVar5 == (char *)0x0) goto LAB_0010eb03;
        *pcVar5 = '\0';
        data = pcVar5 + 1;
        pcVar5 = data;
      } while (uVar7 != num_form_fields);
      uVar2 = num_form_fields;
      if (0 < (int)num_form_fields) {
        lVar6 = 0;
        do {
          pcVar5 = *(char **)((long)&form_fields->name + lVar6);
          if (pcVar5 != (char *)0x0) {
            sVar3 = strlen(pcVar5);
            mg_url_decode(pcVar5,(int)sVar3,pcVar5,(int)sVar3 + 1,1);
          }
          pcVar5 = *(char **)((long)&form_fields->value + lVar6);
          if (pcVar5 != (char *)0x0) {
            sVar3 = strlen(pcVar5);
            mg_url_decode(pcVar5,(int)sVar3,pcVar5,(int)sVar3 + 1,1);
          }
          lVar6 = lVar6 + 0x10;
        } while ((ulong)num_form_fields << 4 != lVar6);
      }
    }
  }
  return uVar2;
}

Assistant:

CIVETWEB_API int
mg_split_form_urlencoded(char *data,
                         struct mg_header *form_fields,
                         unsigned num_form_fields)
{
	char *b;
	int i;
	int num = 0;

	if (data == NULL) {
		/* parameter error */
		return -1;
	}

	if ((form_fields == NULL) && (num_form_fields == 0)) {
		/* determine the number of expected fields */
		if (data[0] == 0) {
			return 0;
		}
		/* count number of & to return the number of key-value-pairs */
		num = 1;
		while (*data) {
			if (*data == '&') {
				num++;
			}
			data++;
		}
		return num;
	}

	if ((form_fields == NULL) || ((int)num_form_fields <= 0)) {
		/* parameter error */
		return -1;
	}

	for (i = 0; i < (int)num_form_fields; i++) {
		/* extract key-value pairs from input data */
		while ((*data == ' ') || (*data == '\t')) {
			/* skip initial spaces */
			data++;
		}
		if (*data == 0) {
			/* end of string reached */
			break;
		}
		form_fields[num].name = data;

		/* find & or = */
		b = data;
		while ((*b != 0) && (*b != '&') && (*b != '=')) {
			b++;
		}

		if (*b == 0) {
			/* last key without value */
			form_fields[num].value = NULL;
		} else if (*b == '&') {
			/* mid key without value */
			form_fields[num].value = NULL;
		} else {
			/* terminate string */
			*b = 0;
			/* value starts after '=' */
			data = b + 1;
			form_fields[num].value = data;
		}

		/* new field is stored */
		num++;

		/* find a next key */
		b = strchr(data, '&');
		if (b == 0) {
			/* no more data */
			break;
		} else {
			/* terminate value of last field at '&' */
			*b = 0;
			/* next key-value-pairs starts after '&' */
			data = b + 1;
		}
	}

	/* Decode all values */
	for (i = 0; i < num; i++) {
		if (form_fields[i].name) {
			url_decode_in_place((char *)form_fields[i].name);
		}
		if (form_fields[i].value) {
			url_decode_in_place((char *)form_fields[i].value);
		}
	}

	/* return number of fields found */
	return num;
}